

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall util::exception::exception<char_const(&)[51]>(exception *this,char (*args) [51])

{
  char (*in_RDX) [51];
  string local_38;
  char (*local_18) [51];
  char (*args_local) [51];
  exception *this_local;
  
  local_18 = args;
  args_local = (char (*) [51])this;
  make_string<char_const(&)[51]>(&local_38,(util *)args,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}